

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompletionProvider.cpp
# Opt level: O0

void __thiscall
CompletionProvider::run
          (CompletionProvider *this,Id *id,
          optional<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
          *paramsOpt)

{
  bool bVar1;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_00;
  Type pGVar2;
  Ch *__s;
  File *file_00;
  Point cursorPosition;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  undefined1 local_130 [8];
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  writer;
  StringBuffer buffer;
  CompletionList local_b8;
  undefined1 local_98 [8];
  CompletionList completions;
  File *file;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string uri;
  Value *textDocumentIdentifier;
  Value *params;
  optional<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
  *paramsOpt_local;
  Id *id_local;
  CompletionProvider *this_local;
  
  bVar1 = ::optional::operator_cast_to_bool((optional *)paramsOpt);
  if (bVar1) {
    this_00 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               *)optional<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                 ::operator*(paramsOpt);
    uri.field_2._8_8_ =
         rapidjson::
         GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
         ::operator[]<char_const>(this_00,"textDocument");
    pGVar2 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)uri.field_2._8_8_,"uri");
    __s = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetString(pGVar2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_50,__s,&local_51);
    std::allocator<char>::~allocator(&local_51);
    file_00 = FileManager::get((string *)local_50);
    if (file_00 == (File *)0x0) {
      std::operator<<((ostream *)&std::cerr,"!!! Null file !!!\n");
      sendNullResult(id);
      completions.items.super__Vector_base<CompletionItem,_std::allocator<CompletionItem>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    }
    else {
      CompletionList::CompletionList((CompletionList *)local_98);
      if (file_00->type == Tex) {
        pGVar2 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>(this_00,"position");
        cursorPosition = getPointFromJSON(pGVar2);
        getLatexCompletionsForFileAndPoint(&local_b8,file_00,cursorPosition);
        CompletionList::operator=((CompletionList *)local_98,&local_b8);
        CompletionList::~CompletionList(&local_b8);
        bVar1 = CompletionList::empty((CompletionList *)local_98);
        if (bVar1) {
          sendNullResult(id);
        }
        else {
          rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
          GenericStringBuffer((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *
                              )&writer.maxDecimalPlaces_,(CrtAllocator *)0x0,0x100);
          rapidjson::
          Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
          ::Writer((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                    *)local_130,
                   (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                   &writer.maxDecimalPlaces_,(CrtAllocator *)0x0,0x20);
          rapidjson::
          Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
          ::StartObject((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                         *)local_130);
          local_138 = "jsonrpc";
          rapidjson::
          Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
          ::Key((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                 *)local_130,&local_138);
          local_140 = "2.0";
          rapidjson::
          Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
          ::String((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                    *)local_130,&local_140);
          local_148 = "id";
          rapidjson::
          Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
          ::Key((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                 *)local_130,&local_148);
          Id::writeId(id,(StringWriter *)local_130);
          local_150 = "result";
          rapidjson::
          Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
          ::Key((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                 *)local_130,&local_150);
          CompletionList::reflect((CompletionList *)local_98,(StringWriter *)local_130);
          rapidjson::
          Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
          ::EndObject((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                       *)local_130,0);
          sendMessage((StringBuffer *)&writer.maxDecimalPlaces_);
          rapidjson::
          Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
          ::~Writer((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                     *)local_130);
          rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
          ~GenericStringBuffer
                    ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                     &writer.maxDecimalPlaces_);
        }
        completions.items.super__Vector_base<CompletionItem,_std::allocator<CompletionItem>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      }
      else {
        sendNullResult(id);
        completions.items.super__Vector_base<CompletionItem,_std::allocator<CompletionItem>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      }
      CompletionList::~CompletionList((CompletionList *)local_98);
    }
    std::__cxx11::string::~string((string *)local_50);
  }
  else {
    sendError(id,InvalidParams,"Missing params for autocomplete request",(Value *)0x0);
  }
  return;
}

Assistant:

void CompletionProvider::run (Id &id, optional<Value> &paramsOpt) {
    if (!paramsOpt) {
        sendError(&id, ResponseHandler::ErrorCode::InvalidParams, "Missing params for autocomplete request");
        return;
    }

    Value &params = *paramsOpt;

    Value &textDocumentIdentifier = params["textDocument"];
    string uri = textDocumentIdentifier["uri"].GetString();

    File *file = FileManager::get(uri);
    if (file == nullptr) {
        std::cerr << "!!! Null file !!!\n";
        sendNullResult(id);
        return;
    }

    CompletionList completions;

    switch (file->type) {
        case File::Type::Tex:
            completions = getLatexCompletionsForFileAndPoint(*file, getPointFromJSON(params["position"]));
            break;
        case File::Type::Bib:
            // TODO
        default:
            sendNullResult(id);
            return;
    }

    if (completions.empty()) {
        sendNullResult(id);
    } else {
        INIT_WRITER
        ADD_ID(id);
        writer.Key("result"); completions.reflect(writer);
        SEND_MESSAGE
    }
}